

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::DirWatcherGeneric::~DirWatcherGeneric(DirWatcherGeneric *this)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  _Base_ptr p_Var2;
  pointer pFVar3;
  allocator local_139;
  string local_138;
  string local_118;
  DirectorySnapshotDiff Diff;
  
  if (this->Deleted == true) {
    DirectorySnapshot::scan(&Diff,&this->DirSnap);
    bVar1 = DirectorySnapshot::exists(&this->DirSnap);
    if (!bVar1) {
      for (pFVar3 = Diff.FilesDeleted.
                    super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pFVar3 != Diff.FilesDeleted.
                    super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                    super__Vector_impl_data._M_finish; pFVar3 = pFVar3 + 1) {
        std::__cxx11::string::string((string *)&local_118,"",&local_139);
        handleAction(this,&pFVar3->Filepath,2,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
      }
      for (pFVar3 = Diff.DirsDeleted.
                    super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pFVar3 != Diff.DirsDeleted.
                    super__Vector_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                    super__Vector_impl_data._M_finish; pFVar3 = pFVar3 + 1) {
        std::__cxx11::string::string((string *)&local_138,"",&local_139);
        handleAction(this,&pFVar3->Filepath,2,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
      }
    }
    DirectorySnapshotDiff::~DirectorySnapshotDiff(&Diff);
  }
  p_Var2 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->Directories)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
      ::~_Rb_tree(&(this->Directories)._M_t);
      DirectorySnapshot::~DirectorySnapshot(&this->DirSnap);
      return;
    }
    this_00 = *(DirWatcherGeneric **)(p_Var2 + 2);
    if (this->Deleted == true) {
      this_00->Deleted = true;
LAB_0010e865:
      ~DirWatcherGeneric(this_00);
      operator_delete(this_00);
      *(undefined8 *)(p_Var2 + 2) = 0;
    }
    else if (this_00 != (DirWatcherGeneric *)0x0) goto LAB_0010e865;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

DirWatcherGeneric::~DirWatcherGeneric() {
	/// If the directory was deleted mark the files as deleted
	if ( Deleted ) {
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( !DirSnap.exists() ) {
			FileInfoList::iterator it;

			DiffIterator( FilesDeleted ) {
				handleAction( ( *it ).Filepath, Actions::Delete );
			}

			DiffIterator( DirsDeleted ) {
				handleAction( ( *it ).Filepath, Actions::Delete );
			}
		}
	}

	DirWatchMap::iterator it = Directories.begin();

	for ( ; it != Directories.end(); ++it ) {
		if ( Deleted ) {
			/// If the directory was deleted, mark the flag for file deletion
			it->second->Deleted = true;
		}

		efSAFE_DELETE( it->second );
	}
}